

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.h
# Opt level: O2

_ReductionJob * __thiscall
r_exec::_Mem::JobQueue<r_exec::_ReductionJob>::popJob(JobQueue<r_exec::_ReductionJob> *this)

{
  queue<r_exec::_ReductionJob_*,_std::deque<r_exec::_ReductionJob_*,_std::allocator<r_exec::_ReductionJob_*>_>_>
  *this_00;
  _ReductionJob *p_Var1;
  size_type sVar2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  std::unique_lock<std::mutex>::unique_lock(&local_30,&this->m_popMutex);
  std::mutex::lock(&this->m_mutex);
  this_00 = &this->m_jobs;
  while( true ) {
    sVar2 = std::deque<r_exec::_ReductionJob_*,_std::allocator<r_exec::_ReductionJob_*>_>::size
                      (&this_00->c);
    if (sVar2 != 0) break;
    pthread_mutex_unlock((pthread_mutex_t *)this);
    std::condition_variable::wait((unique_lock *)&this->m_canPopCondition);
    std::mutex::lock(&this->m_mutex);
  }
  p_Var1 = *(this->m_jobs).c.
            super__Deque_base<r_exec::_ReductionJob_*,_std::allocator<r_exec::_ReductionJob_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  std::deque<r_exec::_ReductionJob_*,_std::allocator<r_exec::_ReductionJob_*>_>::pop_front
            (&this_00->c);
  sVar2 = std::deque<r_exec::_ReductionJob_*,_std::allocator<r_exec::_ReductionJob_*>_>::size
                    (&this_00->c);
  if (sVar2 < 0x400) {
    std::condition_variable::notify_all();
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return p_Var1;
}

Assistant:

Type *popJob()
        {
            std::unique_lock<std::mutex> lock(m_popMutex);
            m_mutex.lock();

            while (m_jobs.size() < 1) { // while, because of spurious wakeups
                m_mutex.unlock();
                m_canPopCondition.wait(lock);
                m_mutex.lock();
            }

            Type *r = m_jobs.front();
            m_jobs.pop();

            if (m_jobs.size() < 1024) {
                m_canPushCondition.notify_all();
            }

            m_mutex.unlock();
            return r;
        }